

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_sparse.c
# Opt level: O2

int check_matrix_entry(SUNMatrix A,realtype val,realtype tol)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  
  lVar2 = SUNSparseMatrix_Data();
  lVar3 = SUNSparseMatrix_IndexPointers(A);
  lVar4 = SUNSparseMatrix_NP(A);
  uVar5 = *(ulong *)(lVar3 + lVar4 * 8);
  uVar6 = 0;
  if ((long)uVar5 < 1) {
    uVar5 = uVar6;
  }
  for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
    dVar1 = *(double *)(lVar2 + uVar7 * 8);
    uVar8 = 1;
    if (!NAN(dVar1)) {
      uVar8 = (uint)(tol < ABS((dVar1 - val) / val));
    }
    uVar6 = (ulong)((int)uVar6 + uVar8);
  }
  return (int)((int)uVar6 != 0);
}

Assistant:

int check_matrix_entry(SUNMatrix A, realtype val, realtype tol)
{
  int failure = 0;
  realtype *Adata;
  sunindextype *indexptrs;
  sunindextype i, NP;

  /* get data pointer */
  Adata = SUNSparseMatrix_Data(A);

  /* compare data */
  indexptrs = SUNSparseMatrix_IndexPointers(A);
  NP = SUNSparseMatrix_NP(A);
  for(i=0; i < indexptrs[NP]; i++){
    failure += FNEQ(Adata[i], val, tol);
  }

  if (failure > ZERO)
    return(1);
  else
    return(0);
}